

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall addrman_tests::addrman_getaddr::test_method(addrman_getaddr *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  CService ipIn_02;
  CService ipIn_03;
  CService ipIn_04;
  CService ipIn_05;
  CService ipIn_06;
  __single_object _Var2;
  bool bVar3;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator pvVar10;
  iterator in_R9;
  CAddress *pCVar11;
  size_t *psVar12;
  string *psVar13;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l;
  const_string file_02;
  initializer_list<CAddress> __l_00;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  initializer_list<CAddress> __l_01;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  check_type cVar14;
  undefined8 in_stack_fffffffffffff948;
  undefined8 in_stack_fffffffffffff950;
  undefined8 in_stack_fffffffffffff958;
  undefined8 in_stack_fffffffffffff960;
  undefined8 in_stack_fffffffffffff968;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  allocator_type local_619;
  int octet2;
  int octet1;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  vector<CAddress,_std::allocator<CAddress>_> vAddr1;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  __single_object addrman;
  vector<CAddress,_std::allocator<CAddress>_> vAddr;
  CService local_3d8;
  string local_3b0;
  string local_390;
  size_t percent23;
  element_type *local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_360;
  CService local_350;
  CService local_328;
  CAddress addr;
  CAddress local_2c8;
  CAddress local_290;
  CNetAddr source2;
  CNetAddr source1;
  CService local_218;
  CAddress addr5;
  CService local_1b8;
  CAddress addr4;
  CService local_158;
  CAddress addr3;
  CService local_f8;
  CAddress addr2;
  CService local_98;
  CAddress addr1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  addr.super_CService.super_CNetAddr.m_addr._union._0_4_ =
       GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)&addrman,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x17d;
  file.m_begin = (iterator)&local_428;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_438,msg);
  addr.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011480b0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_440 = "";
  addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  addr2.super_CService.super_CNetAddr.m_addr._union._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr,&local_448,0x17d);
  pvVar10 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  AddrMan::GetAddr(&vAddr1,(AddrMan *)
                           addrman._M_t.
                           super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                           super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                           super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x17f;
  file_00.m_begin = (iterator)&local_470;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_480,
             msg_00);
  addr.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011480b0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_488 = "";
  addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)(((long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x38);
  pCVar11 = &addr1;
  addr2.super_CService.super_CNetAddr.m_addr._union._0_4_ = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr,&local_490,0x17f,1,2,pCVar11,"vAddr1.size()",&addr2,"0U",0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr,"250.250.2.1",(allocator<char> *)&addr2);
  ResolveService(&local_98,(string *)&addr,0x208d);
  ipIn.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff950;
  ipIn.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)in_stack_fffffffffffff948;
  ipIn.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff958;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffff960;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
  ipIn._32_8_ = in_stack_fffffffffffff968;
  CAddress::CAddress(&addr1,ipIn,(ServiceFlags)&local_98);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98);
  std::__cxx11::string::~string((string *)&addr);
  addr1.nTime.__d.__r =
       (duration)
       Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr,"250.251.2.2",(allocator<char> *)&addr3);
  ResolveService(&local_f8,(string *)&addr,9999);
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff950;
  ipIn_00.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffff948;
  ipIn_00.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff958;
  ipIn_00.super_CNetAddr.m_net = (int)in_stack_fffffffffffff960;
  ipIn_00.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
  ipIn_00._32_8_ = in_stack_fffffffffffff968;
  CAddress::CAddress(&addr2,ipIn_00,(ServiceFlags)&local_f8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8);
  std::__cxx11::string::~string((string *)&addr);
  addr2.nTime.__d.__r =
       (duration)
       Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr,"251.252.2.3",(allocator<char> *)&addr4);
  ResolveService(&local_158,(string *)&addr,0x208d);
  ipIn_01.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff950;
  ipIn_01.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffff948;
  ipIn_01.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff958;
  ipIn_01.super_CNetAddr.m_net = (int)in_stack_fffffffffffff960;
  ipIn_01.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
  ipIn_01._32_8_ = in_stack_fffffffffffff968;
  CAddress::CAddress(&addr3,ipIn_01,(ServiceFlags)&local_158);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_158);
  std::__cxx11::string::~string((string *)&addr);
  addr3.nTime.__d.__r =
       (duration)
       Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr,"252.253.3.4",(allocator<char> *)&addr5);
  ResolveService(&local_1b8,(string *)&addr,0x208d);
  ipIn_02.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff950;
  ipIn_02.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffff948;
  ipIn_02.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff958;
  ipIn_02.super_CNetAddr.m_net = (int)in_stack_fffffffffffff960;
  ipIn_02.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
  ipIn_02._32_8_ = in_stack_fffffffffffff968;
  CAddress::CAddress(&addr4,ipIn_02,(ServiceFlags)&local_1b8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1b8);
  std::__cxx11::string::~string((string *)&addr);
  addr4.nTime.__d.__r =
       (duration)
       Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr,"252.254.4.5",(allocator<char> *)&vAddr);
  ResolveService(&local_218,(string *)&addr,0x208d);
  ipIn_03.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff950;
  ipIn_03.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffff948;
  ipIn_03.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff958;
  ipIn_03.super_CNetAddr.m_net = (int)in_stack_fffffffffffff960;
  ipIn_03.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
  ipIn_03._32_8_ = in_stack_fffffffffffff968;
  CAddress::CAddress(&addr5,ipIn_03,(ServiceFlags)&local_218);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_218);
  std::__cxx11::string::~string((string *)&addr);
  addr5.nTime.__d.__r =
       (duration)
       Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr,"250.1.2.1",(allocator<char> *)&vAddr);
  ResolveIP(&source1,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr,"250.2.3.3",(allocator<char> *)&vAddr);
  ResolveIP(&source2,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x18f;
  file_01.m_begin = (iterator)&local_4a0;
  msg_01.m_end = (iterator)pCVar11;
  msg_01.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4b0,
             msg_01);
  _Var2 = addrman;
  CAddress::CAddress(&addr,&addr1);
  CAddress::CAddress(&local_2c8,&addr3);
  CAddress::CAddress(&local_290,&addr5);
  __l._M_len = 3;
  __l._M_array = &addr;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_390,__l,(allocator_type *)&octet1
            );
  _cVar14 = 0x1ef114;
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_390,&source1,
                       (seconds)0x0);
  percent23 = CONCAT71(percent23._1_7_,bVar3);
  local_368 = (element_type *)0x0;
  aStack_360._M_allocated_capacity = 0;
  local_3b0._M_dataplus._M_p = "addrman->Add({addr1, addr3, addr5}, source1)";
  local_3b0._M_string_length = 0xb65838;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_011481f0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4b8 = "";
  pvVar10 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&percent23,(lazy_ostream *)&vAddr,1,0,WARN,_cVar14,
             (size_t)&local_4c0,399);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_360._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_390);
  lVar6 = 0x70;
  do {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&addr.super_CService.super_CNetAddr.m_addr._union + lVar6));
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != -0x38);
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x190;
  file_02.m_begin = (iterator)&local_4d0;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4e0,
             msg_02);
  _Var2 = addrman;
  CAddress::CAddress(&addr,&addr2);
  CAddress::CAddress(&local_2c8,&addr4);
  __l_00._M_len = 2;
  __l_00._M_array = &addr;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_390,__l_00,
             (allocator_type *)&octet1);
  _cVar14 = 0x1ef27b;
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_390,&source2,
                       (seconds)0x0);
  percent23 = CONCAT71(percent23._1_7_,bVar3);
  local_368 = (element_type *)0x0;
  aStack_360._M_allocated_capacity = 0;
  local_3b0._M_dataplus._M_p = "addrman->Add({addr2, addr4}, source2)";
  local_3b0._M_string_length = 0xb6585e;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_011481f0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4e8 = "";
  pvVar10 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&percent23,(lazy_ostream *)&vAddr,1,0,WARN,_cVar14,
             (size_t)&local_4f0,400);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_360._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_390);
  lVar6 = 0x38;
  do {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&addr.super_CService.super_CNetAddr.m_addr._union + lVar6));
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != -0x38);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x192;
  file_03.m_begin = (iterator)&local_500;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_510,
             msg_03);
  addr.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011480b0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_518 = "";
  AddrMan::GetAddr(&vAddr,(AddrMan *)
                          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                          ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  percent23 = (CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_) -
              (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x38;
  psVar12 = &percent23;
  local_390._M_dataplus._M_p._0_4_ = 5;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr,&local_520,0x192,1,2,psVar12,"addrman->GetAddr( 0, 0, std::nullopt).size()",
             &local_390,"5U",0x38);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x194;
  file_04.m_begin = (iterator)&local_530;
  msg_04.m_end = (iterator)psVar12;
  msg_04.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_540,
             msg_04);
  addr.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011480b0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_548 = "";
  AddrMan::GetAddr(&vAddr,(AddrMan *)
                          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                          ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0x9c4,0x17,
                   (optional<Network>)0x0,true);
  percent23 = (CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_) -
              (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x38;
  psVar12 = &percent23;
  local_390._M_dataplus._M_p._0_4_ = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr,&local_550,0x194,1,2,psVar12,"addrman->GetAddr( 2500, 23, std::nullopt).size()",
             &local_390,"1U");
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x197;
  file_05.m_begin = (iterator)&local_560;
  msg_05.m_end = (iterator)psVar12;
  msg_05.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_570,
             msg_05);
  _Var2 = addrman;
  CService::CService(&local_328,&addr1.super_CService);
  ipIn_04.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff950;
  ipIn_04.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffff948;
  ipIn_04.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff958;
  ipIn_04.super_CNetAddr.m_net = (int)in_stack_fffffffffffff960;
  ipIn_04.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
  ipIn_04._32_8_ = in_stack_fffffffffffff968;
  CAddress::CAddress(&addr,ipIn_04,(ServiceFlags)&local_328);
  tVar4 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  _cVar14 = 0x1ef5ed;
  bVar3 = AddrMan::Good((AddrMan *)
                        _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,
                        (NodeSeconds)tVar4.__d.__r);
  percent23 = CONCAT71(percent23._1_7_,bVar3);
  local_368 = (element_type *)0x0;
  aStack_360._M_allocated_capacity = 0;
  local_390._M_dataplus._M_p = "addrman->Good(CAddress(addr1, NODE_NONE))";
  local_390._M_string_length = 0xb65773;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_011481f0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_578 = "";
  pvVar10 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&percent23,(lazy_ostream *)&vAddr,1,0,WARN,_cVar14,
             (size_t)&local_580,0x197);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_360._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_328);
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x198;
  file_06.m_begin = (iterator)&local_590;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_5a0,
             msg_06);
  _Var2 = addrman;
  CService::CService(&local_350,&addr2.super_CService);
  ipIn_05.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff950;
  ipIn_05.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffff948;
  ipIn_05.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff958;
  ipIn_05.super_CNetAddr.m_net = (int)in_stack_fffffffffffff960;
  ipIn_05.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
  ipIn_05._32_8_ = in_stack_fffffffffffff968;
  CAddress::CAddress(&addr,ipIn_05,(ServiceFlags)&local_350);
  tVar4 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  _cVar14 = 0x1ef722;
  bVar3 = AddrMan::Good((AddrMan *)
                        _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,
                        (NodeSeconds)tVar4.__d.__r);
  percent23 = CONCAT71(percent23._1_7_,bVar3);
  local_368 = (element_type *)0x0;
  aStack_360._M_allocated_capacity = 0;
  local_390._M_dataplus._M_p = "addrman->Good(CAddress(addr2, NODE_NONE))";
  local_390._M_string_length = 0xb6579d;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_011481f0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_5a8 = "";
  pvVar10 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&percent23,(lazy_ostream *)&vAddr,1,0,WARN,_cVar14,
             (size_t)&local_5b0,0x198);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_360._M_allocated_capacity);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_350);
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x199;
  file_07.m_begin = (iterator)&local_5c0;
  msg_07.m_end = pvVar9;
  msg_07.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_5d0,
             msg_07);
  addr.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011480b0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_5d8 = "";
  AddrMan::GetAddr(&vAddr,(AddrMan *)
                          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                          ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  percent23 = (CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_) -
              (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x38;
  psVar12 = &percent23;
  local_390._M_dataplus._M_p._0_4_ = 5;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr,&local_5e0,0x199,1,2,psVar12,"addrman->GetAddr( 0, 0, std::nullopt).size()",
             &local_390,"5U");
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x19a;
  file_08.m_begin = (iterator)&local_5f0;
  msg_08.m_end = (iterator)psVar12;
  msg_08.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_600,
             msg_08);
  addr.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011480b0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_608 = "";
  AddrMan::GetAddr(&vAddr,(AddrMan *)
                          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                          ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0x9c4,0x17,
                   (optional<Network>)0x0,true);
  percent23 = (CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_) -
              (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x38;
  local_390._M_dataplus._M_p._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr,&local_610,0x19a,1,2,&percent23,
             "addrman->GetAddr( 2500, 23, std::nullopt).size()",&local_390,"1U");
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  uVar8 = 1;
  while (uVar7 = (uint)uVar8, uVar7 != 0x800) {
    octet1 = uVar7 & 0xff;
    octet2 = (int)(uVar8 >> 8);
    util::ToString<int>(&local_390,&octet1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vAddr,
                   &local_390,".");
    util::ToString<int>(&local_3b0,&octet2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vAddr,
                   &local_3b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&percent23,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr,
                   ".1.23");
    std::__cxx11::string::~string((string *)&addr);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&vAddr);
    std::__cxx11::string::~string((string *)&local_390);
    ResolveService(&local_3d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&percent23,0
                  );
    ipIn_06.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff950;
    ipIn_06.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         (char *)in_stack_fffffffffffff948;
    ipIn_06.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff958;
    ipIn_06.super_CNetAddr.m_net = (int)in_stack_fffffffffffff960;
    ipIn_06.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
    ipIn_06._32_8_ = in_stack_fffffffffffff968;
    CAddress::CAddress(&addr,ipIn_06,(ServiceFlags)&local_3d8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3d8);
    addr.nTime.__d.__r =
         (duration)
         Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    _Var2 = addrman;
    CAddress::CAddress((CAddress *)&vAddr,&addr);
    __l_01._M_len = 1;
    __l_01._M_array = (CAddress *)&vAddr;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_3b0,__l_01,&local_619);
    ResolveIP((CNetAddr *)&local_390,(string *)&percent23);
    AddrMan::Add((AddrMan *)
                 _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                 super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                 super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                 (vector<CAddress,_std::allocator<CAddress>_> *)&local_3b0,(CNetAddr *)&local_390,
                 (seconds)0x0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_390);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_3b0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&vAddr);
    _Var2 = addrman;
    if ((uVar8 & 7) == 0) {
      tVar4 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ();
      AddrMan::Good((AddrMan *)
                    _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,
                    (NodeSeconds)tVar4.__d.__r);
    }
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
    std::__cxx11::string::~string((string *)&percent23);
    uVar8 = (ulong)(uVar7 + 1);
  }
  pvVar10 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  AddrMan::GetAddr(&vAddr,(AddrMan *)
                          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                          ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0x9c4,0x17,
                   (optional<Network>)0x0,true);
  sVar5 = AddrMan::Size((AddrMan *)
                        addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                        (optional<bool>)0x0);
  percent23 = (sVar5 * 0x17) / 100;
  local_630 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x1ac;
  file_09.m_begin = (iterator)&local_630;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_640,
             msg_09);
  addr.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011480b0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_648 = "";
  local_390._M_dataplus._M_p =
       (pointer)((CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                           super__Vector_impl_data._M_finish._1_7_,
                           vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                           super__Vector_impl_data._M_finish._0_1_) -
                 (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x38);
  psVar13 = &local_390;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&addr,&local_650,0x1ac,1,2,psVar13,"vAddr.size()",&percent23,"percent23");
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x1ad;
  file_10.m_begin = (iterator)&local_660;
  msg_10.m_end = (iterator)psVar13;
  msg_10.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_670,
             msg_10);
  addr.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011480b0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_678 = "";
  local_390._M_dataplus._M_p =
       (pointer)((CONCAT71(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                           super__Vector_impl_data._M_finish._1_7_,
                           vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                           super__Vector_impl_data._M_finish._0_1_) -
                 (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x38);
  psVar13 = &local_390;
  local_3b0._M_dataplus._M_p._0_4_ = 0x1cd;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr,&local_680,0x1ad,1,2,psVar13,"vAddr.size()",&local_3b0,"461U");
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_688 = "";
  file_11.m_end = (iterator)0x1af;
  file_11.m_begin = (iterator)&local_690;
  msg_11.m_end = (iterator)psVar13;
  msg_11.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
             (size_t)&stack0xfffffffffffff960,msg_11);
  addr.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011480b0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_390._M_dataplus._M_p =
       (pointer)AddrMan::Size((AddrMan *)
                              addrman._M_t.
                              super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                              super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                              super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                              (optional<Network>)0x0,(optional<bool>)0x0);
  local_3b0._M_dataplus._M_p._0_4_ = 0x7d6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr,&stack0xfffffffffffff950,0x1af,1,2,&local_390,"addrman->Size()",&local_3b0,
             "2006U");
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source2.m_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source1.m_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr5);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr4);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr3);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr1);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_getaddr)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    // Test: Sanity check, GetAddr should never return anything if addrman
    //  is empty.
    BOOST_CHECK_EQUAL(addrman->Size(), 0U);
    std::vector<CAddress> vAddr1 = addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt);
    BOOST_CHECK_EQUAL(vAddr1.size(), 0U);

    CAddress addr1 = CAddress(ResolveService("250.250.2.1", 8333), NODE_NONE);
    addr1.nTime = Now<NodeSeconds>(); // Set time so isTerrible = false
    CAddress addr2 = CAddress(ResolveService("250.251.2.2", 9999), NODE_NONE);
    addr2.nTime = Now<NodeSeconds>();
    CAddress addr3 = CAddress(ResolveService("251.252.2.3", 8333), NODE_NONE);
    addr3.nTime = Now<NodeSeconds>();
    CAddress addr4 = CAddress(ResolveService("252.253.3.4", 8333), NODE_NONE);
    addr4.nTime = Now<NodeSeconds>();
    CAddress addr5 = CAddress(ResolveService("252.254.4.5", 8333), NODE_NONE);
    addr5.nTime = Now<NodeSeconds>();
    CNetAddr source1 = ResolveIP("250.1.2.1");
    CNetAddr source2 = ResolveIP("250.2.3.3");

    // Test: Ensure GetAddr works with new addresses.
    BOOST_CHECK(addrman->Add({addr1, addr3, addr5}, source1));
    BOOST_CHECK(addrman->Add({addr2, addr4}, source2));

    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt).size(), 5U);
    // Net processing asks for 23% of addresses. 23% of 5 is 1 rounded down.
    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/2500, /*max_pct=*/23, /*network=*/std::nullopt).size(), 1U);

    // Test: Ensure GetAddr works with new and tried addresses.
    BOOST_CHECK(addrman->Good(CAddress(addr1, NODE_NONE)));
    BOOST_CHECK(addrman->Good(CAddress(addr2, NODE_NONE)));
    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt).size(), 5U);
    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/2500, /*max_pct=*/23, /*network=*/std::nullopt).size(), 1U);

    // Test: Ensure GetAddr still returns 23% when addrman has many addrs.
    for (unsigned int i = 1; i < (8 * 256); i++) {
        int octet1 = i % 256;
        int octet2 = i >> 8 % 256;
        std::string strAddr = ToString(octet1) + "." + ToString(octet2) + ".1.23";
        CAddress addr = CAddress(ResolveService(strAddr), NODE_NONE);

        // Ensure that for all addrs in addrman, isTerrible == false.
        addr.nTime = Now<NodeSeconds>();
        addrman->Add({addr}, ResolveIP(strAddr));
        if (i % 8 == 0)
            addrman->Good(addr);
    }
    std::vector<CAddress> vAddr = addrman->GetAddr(/*max_addresses=*/2500, /*max_pct=*/23, /*network=*/std::nullopt);

    size_t percent23 = (addrman->Size() * 23) / 100;
    BOOST_CHECK_EQUAL(vAddr.size(), percent23);
    BOOST_CHECK_EQUAL(vAddr.size(), 461U);
    // (addrman.Size() < number of addresses added) due to address collisions.
    BOOST_CHECK_EQUAL(addrman->Size(), 2006U);
}